

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::StreamingListener::~StreamingListener(StreamingListener *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__StreamingListener_00246c88;
  if (*(int *)(in_RDI + 1) != -1) {
    CloseConnection(this);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  EmptyTestEventListener::~EmptyTestEventListener((EmptyTestEventListener *)0x20620b);
  return;
}

Assistant:

virtual ~StreamingListener() {
    if (sockfd_ != -1)
      CloseConnection();
  }